

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::DumpMarkTemp(BackwardPass *this)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x194c,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pBVar1 = this->currentBlock;
  if (this->tag == BackwardPhase) {
    bVar3 = SatisfyMarkTempObjectsConditions(this);
    if (bVar3) {
      TempTrackerBase::Dump((TempTrackerBase *)pBVar1->tempObjectTracker,L"MarkTempObject");
    }
  }
  if (this->tag == DeadStorePhase) {
    bVar3 = SatisfyMarkTempObjectsConditions(this);
    if (bVar3) {
      TempTrackerBase::Dump
                ((TempTrackerBase *)pBVar1->tempObjectVerifyTracker,L"MarkTempObjectVerify");
      return;
    }
  }
  return;
}

Assistant:

void
BackwardPass::DumpMarkTemp()
{
    Assert(!IsCollectionPass());

    BasicBlock * block = this->currentBlock;
    if (this->DoMarkTempNumbers())
    {
        block->tempNumberTracker->Dump();
    }
    if (this->DoMarkTempObjects())
    {
        block->tempObjectTracker->Dump();
    }
#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        block->tempObjectVerifyTracker->Dump();
    }
#endif
}